

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O1

REF_STATUS
ref_node_interpolate_face
          (REF_NODE ref_node,REF_INT node0,REF_INT node1,REF_INT node2,REF_INT new_node)

{
  int iVar1;
  REF_GLOB *pRVar2;
  REF_DBL *pRVar3;
  uint uVar4;
  undefined8 uVar5;
  long lVar6;
  ulong uVar7;
  char *pcVar8;
  REF_DBL log_m [6];
  REF_DBL log_m2 [6];
  REF_DBL log_m1 [6];
  REF_DBL log_m0 [6];
  REF_DBL local_d8 [6];
  REF_DBL aRStack_a8 [6];
  REF_DBL aRStack_78 [6];
  REF_DBL aRStack_48 [6];
  
  if ((((((node0 < 0) || (iVar1 = ref_node->max, iVar1 <= node0)) || (iVar1 <= node1)) ||
       ((node1 < 0 || (pRVar2 = ref_node->global, pRVar2[(uint)node0] < 0)))) ||
      ((iVar1 <= node2 || ((node2 < 0 || (pRVar2[(uint)node1] < 0)))))) || (pRVar2[(uint)node2] < 0)
     ) {
    pcVar8 = "node invalid";
    uVar4 = 3;
    uVar5 = 0xa5c;
    uVar7 = 3;
  }
  else {
    pRVar3 = ref_node->real;
    lVar6 = 0;
    do {
      pRVar3[new_node * 0xf + lVar6] =
           (pRVar3[(ulong)(uint)(node0 * 0xf) + lVar6] + pRVar3[(ulong)(uint)(node1 * 0xf) + lVar6]
           + pRVar3[(ulong)(uint)(node2 * 0xf) + lVar6]) * 0.3333333333333333;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 3);
    iVar1 = ref_node->naux;
    if (0 < (long)iVar1) {
      pRVar3 = ref_node->aux;
      lVar6 = 0;
      do {
        pRVar3[iVar1 * new_node + lVar6] =
             (pRVar3[(ulong)(uint)(iVar1 * node0) + lVar6] +
              pRVar3[(ulong)(uint)(iVar1 * node1) + lVar6] +
             pRVar3[(ulong)(uint)(iVar1 * node2) + lVar6]) * 0.3333333333333333;
        lVar6 = lVar6 + 1;
      } while (iVar1 != lVar6);
    }
    pRVar3 = ref_node->real;
    lVar6 = 0;
    do {
      aRStack_48[lVar6] = pRVar3[node0 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    do {
      aRStack_78[lVar6] = pRVar3[node1 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    do {
      aRStack_a8[lVar6] = pRVar3[node2 * 0xf + 9 + (int)lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    lVar6 = 0;
    do {
      local_d8[lVar6] =
           (aRStack_48[lVar6] + aRStack_78[lVar6] + aRStack_a8[lVar6]) * 0.3333333333333333;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    uVar4 = ref_node_metric_set_log(ref_node,new_node,local_d8);
    if (uVar4 == 0) {
      return 0;
    }
    pcVar8 = "log new";
    uVar5 = 0xa71;
    uVar7 = (ulong)uVar4;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar5,
         "ref_node_interpolate_face",uVar7,pcVar8);
  return uVar4;
}

Assistant:

REF_FCN REF_STATUS ref_node_interpolate_face(REF_NODE ref_node, REF_INT node0,
                                             REF_INT node1, REF_INT node2,
                                             REF_INT new_node) {
  REF_DBL log_m0[6], log_m1[6], log_m2[6], log_m[6];
  REF_INT i;

  if (!ref_node_valid(ref_node, node0) || !ref_node_valid(ref_node, node1) ||
      !ref_node_valid(ref_node, node2))
    RSS(REF_INVALID, "node invalid");

  for (i = 0; i < 3; i++)
    ref_node_xyz(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_xyz(ref_node, i, node0) + ref_node_xyz(ref_node, i, node1) +
         ref_node_xyz(ref_node, i, node2));

  for (i = 0; i < ref_node_naux(ref_node); i++)
    ref_node_aux(ref_node, i, new_node) =
        (1.0 / 3.0) *
        (ref_node_aux(ref_node, i, node0) + ref_node_aux(ref_node, i, node1) +
         ref_node_aux(ref_node, i, node2));

  RSS(ref_node_metric_get_log(ref_node, node0, log_m0), "log 0");
  RSS(ref_node_metric_get_log(ref_node, node1, log_m1), "log 1");
  RSS(ref_node_metric_get_log(ref_node, node2, log_m2), "log 2");

  for (i = 0; i < 6; i++)
    log_m[i] = (1.0 / 3.0) * (log_m0[i] + log_m1[i] + log_m2[i]);

  RSS(ref_node_metric_set_log(ref_node, new_node, log_m), "log new");

  return REF_SUCCESS;
}